

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

size_t duckdb_brotli::BrotliEncoderGetPreparedDictionarySize
                 (BrotliEncoderPreparedDictionary *prepared_dictionary)

{
  int iVar1;
  long lVar2;
  long lVar3;
  PreparedDictionary *dictionary;
  BrotliEncoderPreparedDictionary *pBVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = *(int *)prepared_dictionary;
  if (iVar1 == -0x2143121e) {
    prepared_dictionary = *(BrotliEncoderPreparedDictionary **)(prepared_dictionary + 0x20);
    iVar1 = *(int *)prepared_dictionary;
    lVar8 = 0x28;
  }
  else {
    lVar8 = 0;
  }
  if (iVar1 == -0x2143121d) {
    sVar6 = lVar8 + (4L << ((byte)prepared_dictionary[0x14] & 0x3f)) +
            (2L << ((byte)prepared_dictionary[0x10] & 0x3f)) +
            (ulong)*(uint *)(prepared_dictionary + 4) * 4 + 0x20;
  }
  else if (iVar1 == -0x2143121f) {
    lVar2 = *(long *)(prepared_dictionary + 0x198);
    lVar7 = 0x528;
    if (lVar2 != 0) {
      lVar5 = 0;
      do {
        sVar6 = BrotliEncoderGetPreparedDictionarySize
                          (*(BrotliEncoderPreparedDictionary **)
                            (prepared_dictionary + lVar5 * 8 + 0x1a0));
        if (sVar6 == 0) goto LAB_002fd95a;
        lVar7 = lVar7 + sVar6;
        lVar5 = lVar5 + 1;
      } while (lVar2 != lVar5);
    }
    if (*(int *)(prepared_dictionary + 0x220) == 0) {
      pBVar4 = prepared_dictionary + 0x470;
      lVar2 = 1;
    }
    else {
      lVar2 = *(long *)(prepared_dictionary + 0x468);
      pBVar4 = *(BrotliEncoderPreparedDictionary **)(prepared_dictionary + 0x518);
      lVar7 = lVar7 + lVar2 * 0xa8;
    }
    if (lVar2 != 0) {
      pBVar4 = pBVar4 + 0xa0;
      do {
        lVar5 = lVar7 + 0x10000 + *(long *)(pBVar4 + -0x60) * 0xc;
        if (*(long *)(pBVar4 + -0x30) == 0) {
          lVar5 = lVar7 + *(long *)(pBVar4 + -0x60) * 0xc;
        }
        lVar3 = lVar5 + 0x8000;
        if (*(long *)(pBVar4 + -0x28) == 0) {
          lVar3 = lVar5;
        }
        if (*(long *)(pBVar4 + -0x18) != 0) {
          lVar3 = lVar3 + *(long *)(pBVar4 + -0x20) * 2;
        }
        if (*(long *)(pBVar4 + -8) != 0) {
          lVar3 = lVar3 + *(long *)(pBVar4 + -0x10) * 4;
        }
        lVar7 = lVar3 + 0xb0;
        if (*(long *)pBVar4 == 0) {
          lVar7 = lVar3;
        }
        pBVar4 = pBVar4 + 0xa8;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    sVar6 = lVar7 + lVar8;
  }
  else if (iVar1 == -0x21431220) {
    sVar6 = lVar8 + (ulong)*(uint *)(prepared_dictionary + 8) +
            (4L << ((byte)prepared_dictionary[0x14] & 0x3f)) +
            (2L << ((byte)prepared_dictionary[0x10] & 0x3f)) +
            (ulong)*(uint *)(prepared_dictionary + 4) * 4 + 0x18;
  }
  else {
LAB_002fd95a:
    sVar6 = 0;
  }
  return sVar6;
}

Assistant:

size_t duckdb_brotli::BrotliEncoderGetPreparedDictionarySize(
    const BrotliEncoderPreparedDictionary* prepared_dictionary) {
  /* First field of dictionary structs */
  const BrotliEncoderPreparedDictionary* prepared = prepared_dictionary;
  uint32_t magic = *((const uint32_t*)prepared);
  size_t overhead = 0;
  if (magic == kManagedDictionaryMagic) {
    const ManagedDictionary* managed = (const ManagedDictionary*)prepared;
    overhead = sizeof(ManagedDictionary);
    magic = *managed->dictionary;
    prepared = (const BrotliEncoderPreparedDictionary*)managed->dictionary;
  }

  if (magic == kPreparedDictionaryMagic) {
    const PreparedDictionary* dictionary =
        (const PreparedDictionary*)prepared;
    /* Keep in sync with step 3 of CreatePreparedDictionary */
    return sizeof(PreparedDictionary) + dictionary->source_size +
        (sizeof(uint32_t) << dictionary->slot_bits) +
        (sizeof(uint16_t) << dictionary->bucket_bits) +
        (sizeof(uint32_t) * dictionary->num_items) + overhead;
  } else if (magic == kLeanPreparedDictionaryMagic) {
    const PreparedDictionary* dictionary =
        (const PreparedDictionary*)prepared;
    /* Keep in sync with step 3 of CreatePreparedDictionary */
    return sizeof(PreparedDictionary) + sizeof(uint8_t*) +
        (sizeof(uint32_t) << dictionary->slot_bits) +
        (sizeof(uint16_t) << dictionary->bucket_bits) +
        (sizeof(uint32_t) * dictionary->num_items) + overhead;
  } else if (magic == kSharedDictionaryMagic) {
    const SharedEncoderDictionary* dictionary =
        (const SharedEncoderDictionary*)prepared;
    const CompoundDictionary* compound = &dictionary->compound;
    const ContextualEncoderDictionary* contextual = &dictionary->contextual;
    size_t result = sizeof(*dictionary);
    size_t i;
    size_t num_instances;
    const BrotliEncoderDictionary* instances;
    for (i = 0; i < compound->num_prepared_instances_; i++) {
      size_t size = BrotliEncoderGetPreparedDictionarySize(
          (const BrotliEncoderPreparedDictionary*)
          compound->prepared_instances_[i]);
      if (!size) return 0;  /* error */
      result += size;
    }
    if (contextual->context_based) {
      num_instances = contextual->num_instances_;
      instances = contextual->instances_;
      result += sizeof(*instances) * num_instances;
    } else {
      num_instances = 1;
      instances = &contextual->instance_;
    }
    for (i = 0; i < num_instances; i++) {
      const BrotliEncoderDictionary* dict = &instances[i];
      result += dict->trie.pool_capacity * sizeof(BrotliTrieNode);
      if (dict->hash_table_data_words_) {
        result += sizeof(kStaticDictionaryHashWords);
      }
      if (dict->hash_table_data_lengths_) {
        result += sizeof(kStaticDictionaryHashLengths);
      }
      if (dict->buckets_data_) {
        result += sizeof(*dict->buckets_data_) * dict->buckets_alloc_size_;
      }
      if (dict->dict_words_data_) {
        result += sizeof(*dict->dict_words) * dict->dict_words_alloc_size_;
      }
      if (dict->words_instance_) {
        result += sizeof(*dict->words_instance_);
        /* data_size not added here: it is never allocated by the
           SharedEncoderDictionary, instead it always points to the file
           already loaded in memory. So if the caller wants to include
           this memory as well, add the size of the loaded dictionary
           file to this. */
      }
    }
    return result + overhead;
  }
  return 0;  /* error */
}